

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluSwapAdjacent(word *pOut,word *pIn,int iVar,int nVars)

{
  ulong uVar1;
  uint uVar2;
  word *pwVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  word *pwVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  word *pwVar14;
  word *pwVar15;
  word *pwVar16;
  word *pwVar17;
  
  uVar12 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar12 = 1;
  }
  if (iVar < nVars + -1) {
    iVar11 = (int)uVar12;
    if (iVar < 5) {
      uVar10 = 0;
      if (iVar11 < 1) {
        uVar12 = 0;
      }
      for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        uVar1 = pIn[uVar10];
        bVar5 = (byte)(1 << ((byte)iVar & 0x1f));
        pOut[uVar10] = (uVar1 & PMasks[iVar][2]) >> (bVar5 & 0x3f) |
                       (PMasks[iVar][1] & uVar1) << (bVar5 & 0x3f) | PMasks[iVar][0] & uVar1;
      }
    }
    else if (iVar == 5) {
      for (lVar4 = 0; lVar4 < iVar11; lVar4 = lVar4 + 2) {
        pOut[lVar4] = pIn[lVar4 + 1] << 0x20 | (ulong)(uint)pIn[lVar4];
        pOut[lVar4 + 1] =
             CONCAT44(*(undefined4 *)((long)pIn + lVar4 * 8 + 0xc),
                      *(undefined4 *)((long)pIn + lVar4 * 8 + 4));
      }
    }
    else {
      bVar5 = (byte)iVar - 6;
      uVar2 = 1 << (bVar5 & 0x1f);
      iVar13 = 2 << (bVar5 & 0x1f);
      iVar7 = 3 << (bVar5 & 0x1f);
      iVar9 = 4 << (bVar5 & 0x1f);
      iVar6 = 0;
      uVar12 = 0;
      if (0 < 1 << (bVar5 & 0x1f)) {
        uVar12 = (ulong)uVar2;
      }
      pwVar3 = pIn + iVar13;
      pwVar14 = pOut + (int)uVar2;
      pwVar8 = pIn + (int)uVar2;
      pwVar16 = pOut + iVar13;
      pwVar17 = pIn + iVar7;
      pwVar15 = pOut + iVar7;
      for (; iVar6 < iVar11; iVar6 = iVar6 + iVar9) {
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pOut[uVar10] = pIn[uVar10];
        }
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pwVar14[uVar10] = pwVar3[uVar10];
        }
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pwVar16[uVar10] = pwVar8[uVar10];
        }
        for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          pwVar15[uVar10] = pwVar17[uVar10];
        }
        pOut = pOut + iVar9;
        pIn = pIn + iVar9;
        pwVar3 = pwVar3 + iVar9;
        pwVar14 = pwVar14 + iVar9;
        pwVar8 = pwVar8 + iVar9;
        pwVar16 = pwVar16 + iVar9;
        pwVar17 = pwVar17 + iVar9;
        pwVar15 = pwVar15 + iVar9;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                ,0x195,"void If_CluSwapAdjacent(word *, word *, int, int)");
}

Assistant:

static inline void If_CluSwapAdjacent( word * pOut, word * pIn, int iVar, int nVars )
{
    int i, k, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars - 1 );
    if ( iVar < 5 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & PMasks[iVar][0]) | ((pIn[i] & PMasks[iVar][1]) << Shift) | ((pIn[i] & PMasks[iVar][2]) >> Shift);
    }
    else if ( iVar > 5 )
    {
        int Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 4*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pIn[i];
            for ( i = 0; i < Step; i++ )
                pOut[Step+i] = pIn[2*Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[2*Step+i] = pIn[Step+i];
            for ( i = 0; i < Step; i++ )
                pOut[3*Step+i] = pIn[3*Step+i];
            pIn  += 4*Step;
            pOut += 4*Step;
        }
    }
    else // if ( iVar == 5 )
    {
        for ( i = 0; i < nWords; i += 2 )
        {
            pOut[i]   = (pIn[i]   & ABC_CONST(0x00000000FFFFFFFF)) | ((pIn[i+1] & ABC_CONST(0x00000000FFFFFFFF)) << 32);
            pOut[i+1] = (pIn[i+1] & ABC_CONST(0xFFFFFFFF00000000)) | ((pIn[i]   & ABC_CONST(0xFFFFFFFF00000000)) >> 32);
        }
    }
}